

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O1

int act_diff_nims(nt_opts *opts)

{
  uint uVar1;
  nifti_image *s0;
  nifti_image *s1;
  
  if ((opts->infiles).len == 2) {
    if (2 < g_debug) {
      act_diff_nims_cold_1();
    }
    s0 = nt_image_read(opts,*(opts->infiles).list,0);
    uVar1 = 1;
    if (s0 != (nifti_image *)0x0) {
      s1 = nt_image_read(opts,(opts->infiles).list[1],0);
      if (s1 == (nifti_image *)0x0) {
        free(s0);
      }
      else {
        if (1 < g_debug) {
          act_diff_nims_cold_2();
        }
        if ((opts->flist).len < 1) {
          uVar1 = diff_nims(s0,s1,(uint)(0 < g_debug));
        }
        else {
          uVar1 = diff_nims_list(s0,s1,&opts->flist,(uint)(0 < g_debug));
        }
        if (g_debug < 2 || uVar1 != 0) {
          if (2 < g_debug) {
            fprintf(_stderr,"+d %d differences found\n",(ulong)uVar1);
          }
        }
        else {
          act_diff_nims_cold_3();
        }
        nifti_image_free(s0);
        nifti_image_free(s1);
        uVar1 = (uint)(0 < (int)uVar1);
      }
    }
  }
  else {
    fprintf(_stderr,"** -diff_nim requires 2 -infiles, have %d\n");
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

int act_diff_nims( nt_opts * opts )
{
   nifti_image * nim0, * nim1;
   int           diffs = 0;

   if( opts->infiles.len != 2 ){
      fprintf(stderr,"** -diff_nim requires 2 -infiles, have %d\n",
              opts->infiles.len);
      return 1;
   }

   if( g_debug > 2 )
      fprintf(stderr,"-d nifti_image diff between %s and %s...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   /* get the nifiti images */

   nim0 = nt_image_read(opts, opts->infiles.list[0], 0);
   if( ! nim0 ) return 1;  /* errors have been printed */

   nim1 = nt_image_read(opts, opts->infiles.list[1], 0);
   if( ! nim1 ){ free(nim0); return 1; }

   if( g_debug > 1 )
      fprintf(stderr,"\n-d nifti_image diffs between '%s' and '%s'...\n",
              opts->infiles.list[0], opts->infiles.list[1]);

   if( opts->flist.len <= 0 )
      diffs = diff_nims(nim0, nim1, g_debug > 0);
   else
      diffs = diff_nims_list(nim0, nim1, &opts->flist, g_debug > 0);

   if( diffs == 0 && g_debug > 1 )
      fprintf(stderr,"+d no differences found\n");
   else if ( g_debug > 2 )
      fprintf(stderr,"+d %d differences found\n", diffs);

   nifti_image_free(nim0);
   nifti_image_free(nim1);

   return (diffs > 0);
}